

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> *
detail::operator|(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *__return_storage_ptr__,b_str<char> *str,
                 split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 *info)

{
  long lVar1;
  string asStack_48 [32];
  
  lVar1 = std::__cxx11::string::find_last_of((string *)str,(ulong)info);
  if (lVar1 == -1) {
    __return_storage_ptr__->_M_elems[0]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[0].field_2;
    __return_storage_ptr__->_M_elems[0]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[0].field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)(__return_storage_ptr__->_M_elems + 1),(string *)str);
  }
  else {
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
    ::array(__return_storage_ptr__);
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)str);
    std::__cxx11::string::operator=((string *)(__return_storage_ptr__->_M_elems + 1),asStack_48);
    std::__cxx11::string::~string(asStack_48);
    lVar1 = std::__cxx11::string::find_last_not_of((string *)str,(ulong)info);
    std::__cxx11::string::erase((ulong)str,lVar1 + 1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_last, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_last_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { {}, std::move(str) } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(pos + 1);
		str.erase(str.find_last_not_of(info.delim, pos) + 1);
		re[0] = std::move(str);
		return re;
	}